

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
         *this,Vec3fa *ofs,float scale,float r_scale0,LinearSpace3fa *space,size_t i,size_t itime)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  uint uVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  char *pcVar6;
  size_t sVar7;
  BufferView<embree::Vec3fa> *pBVar8;
  char *pcVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined4 uVar57;
  undefined1 auVar61 [12];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  vfloat4 a0;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  vfloat4 a0_1;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar77;
  float fVar80;
  float fVar81;
  vfloat4 b0;
  undefined1 auVar78 [16];
  float fVar82;
  undefined1 auVar79 [32];
  vfloat4 b0_1;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  float fVar95;
  float fVar100;
  float fVar101;
  undefined1 auVar96 [16];
  float fVar102;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [32];
  float fVar103;
  float fVar106;
  float fVar107;
  undefined1 auVar104 [16];
  float fVar108;
  undefined1 auVar105 [16];
  float fVar109;
  undefined1 auVar110 [16];
  undefined1 in_ZMM16 [64];
  
  pBVar5 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           vertices.items;
  uVar4 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar6 = pBVar5[itime].super_RawBufferView.ptr_ofs;
  sVar7 = pBVar5[itime].super_RawBufferView.stride;
  lVar18 = sVar7 * uVar4;
  lVar19 = sVar7 * (uVar4 + 1);
  lVar17 = sVar7 * (uVar4 + 2);
  lVar20 = sVar7 * (uVar4 + 3);
  fVar77 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           maxRadiusScale;
  auVar60 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar18),
                          ZEXT416((uint)(fVar77 * *(float *)(pcVar6 + lVar18 + 0xc))),0x30);
  auVar51 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar19),
                          ZEXT416((uint)(fVar77 * *(float *)(pcVar6 + lVar19 + 0xc))),0x30);
  auVar55 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar17),
                          ZEXT416((uint)(fVar77 * *(float *)(pcVar6 + lVar17 + 0xc))),0x30);
  pBVar8 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           normals.items;
  pcVar9 = pBVar8[itime].super_RawBufferView.ptr_ofs;
  sVar7 = pBVar8[itime].super_RawBufferView.stride;
  auVar25 = *(undefined1 (*) [16])(pcVar9 + uVar4 * sVar7);
  auVar24 = *(undefined1 (*) [16])(pcVar9 + (uVar4 + 1) * sVar7);
  auVar28 = *(undefined1 (*) [16])(pcVar9 + (uVar4 + 2) * sVar7);
  auVar50 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + lVar20),
                          ZEXT416((uint)(fVar77 * *(float *)(pcVar6 + lVar20 + 0xc))),0x30);
  auVar27 = *(undefined1 (*) [16])(pcVar9 + sVar7 * (uVar4 + 3));
  auVar96._8_4_ = 0x80000000;
  auVar96._0_8_ = 0x8000000080000000;
  auVar96._12_4_ = 0x80000000;
  fVar77 = auVar50._0_4_;
  auVar62._0_4_ = fVar77 * -0.0;
  fVar80 = auVar50._4_4_;
  auVar62._4_4_ = fVar80 * -0.0;
  fVar81 = auVar50._8_4_;
  auVar62._8_4_ = fVar81 * -0.0;
  fVar82 = auVar50._12_4_;
  auVar62._12_4_ = fVar82 * -0.0;
  auVar54 = ZEXT816(0) << 0x20;
  auVar50 = vfmadd213ps_fma(ZEXT816(0),auVar55,auVar62);
  auVar26._0_4_ = auVar51._0_4_ + auVar50._0_4_;
  auVar26._4_4_ = auVar51._4_4_ + auVar50._4_4_;
  auVar26._8_4_ = auVar51._8_4_ + auVar50._8_4_;
  auVar26._12_4_ = auVar51._12_4_ + auVar50._12_4_;
  auVar50 = vfmadd231ps_fma(auVar26,auVar60,auVar96);
  auVar53._0_4_ = fVar77 * 0.0;
  auVar53._4_4_ = fVar80 * 0.0;
  auVar53._8_4_ = fVar81 * 0.0;
  auVar53._12_4_ = fVar82 * 0.0;
  auVar104._8_4_ = 0x3f000000;
  auVar104._0_8_ = 0x3f0000003f000000;
  auVar104._12_4_ = 0x3f000000;
  auVar21 = vfmadd231ps_fma(auVar53,auVar55,auVar104);
  auVar21 = vfmadd231ps_fma(auVar21,auVar51,auVar54);
  auVar52 = vfnmadd231ps_fma(auVar21,auVar60,auVar104);
  auVar110._0_4_ = auVar27._0_4_ * -0.0;
  auVar110._4_4_ = auVar27._4_4_ * -0.0;
  auVar110._8_4_ = auVar27._8_4_ * -0.0;
  auVar110._12_4_ = auVar27._12_4_ * -0.0;
  auVar21 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
  auVar21 = vfmadd213ps_avx512vl(auVar21,auVar28,auVar110);
  auVar21 = vaddps_avx512vl(auVar24,auVar21);
  auVar22 = vfmadd231ps_avx512vl(auVar21,auVar25,auVar96);
  auVar21 = vmulps_avx512vl(auVar27,auVar54);
  auVar21 = vfmadd231ps_avx512vl(auVar21,auVar28,auVar104);
  auVar21 = vfmadd231ps_avx512vl(auVar21,auVar24,auVar54);
  auVar23 = vfnmadd231ps_avx512vl(auVar21,auVar25,auVar104);
  auVar63._0_4_ = auVar55._0_4_ + auVar62._0_4_;
  auVar63._4_4_ = auVar55._4_4_ + auVar62._4_4_;
  auVar63._8_4_ = auVar55._8_4_ + auVar62._8_4_;
  auVar63._12_4_ = auVar55._12_4_ + auVar62._12_4_;
  auVar21 = vfmadd231ps_fma(auVar63,auVar51,auVar54);
  auVar21 = vfmadd231ps_fma(auVar21,auVar60,auVar96);
  auVar65._0_4_ = fVar77 * 0.5;
  auVar65._4_4_ = fVar80 * 0.5;
  auVar65._8_4_ = fVar81 * 0.5;
  auVar65._12_4_ = fVar82 * 0.5;
  auVar55 = vfmadd231ps_fma(auVar65,auVar54,auVar55);
  auVar51 = vfnmadd231ps_fma(auVar55,auVar104,auVar51);
  auVar55 = vfmadd231ps_fma(auVar51,auVar54,auVar60);
  auVar67._0_4_ = auVar28._0_4_ + auVar110._0_4_;
  auVar67._4_4_ = auVar28._4_4_ + auVar110._4_4_;
  auVar67._8_4_ = auVar28._8_4_ + auVar110._8_4_;
  auVar67._12_4_ = auVar28._12_4_ + auVar110._12_4_;
  auVar60 = vfmadd231ps_fma(auVar67,auVar24,auVar54);
  auVar60 = vfmadd231ps_fma(auVar60,auVar25,auVar96);
  auVar71._0_4_ = auVar27._0_4_ * 0.5;
  auVar71._4_4_ = auVar27._4_4_ * 0.5;
  auVar71._8_4_ = auVar27._8_4_ * 0.5;
  auVar71._12_4_ = auVar27._12_4_ * 0.5;
  auVar28 = vfmadd231ps_fma(auVar71,auVar54,auVar28);
  auVar24 = vfnmadd231ps_fma(auVar28,auVar24,auVar104);
  auVar26 = vfmadd231ps_fma(auVar24,auVar54,auVar25);
  auVar25 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar24 = vshufps_avx512vl(auVar22,auVar22,0xc9);
  fVar81 = auVar52._0_4_;
  auVar75._0_4_ = auVar24._0_4_ * fVar81;
  fVar10 = auVar52._4_4_;
  auVar75._4_4_ = auVar24._4_4_ * fVar10;
  fVar12 = auVar52._8_4_;
  auVar75._8_4_ = auVar24._8_4_ * fVar12;
  fVar14 = auVar52._12_4_;
  auVar75._12_4_ = auVar24._12_4_ * fVar14;
  auVar24 = vfmsub231ps_avx512vl(auVar75,auVar25,auVar22);
  auVar28 = vshufps_avx(auVar24,auVar24,0xc9);
  auVar24 = vshufps_avx512vl(auVar23,auVar23,0xc9);
  auVar83._0_4_ = auVar24._0_4_ * fVar81;
  auVar83._4_4_ = auVar24._4_4_ * fVar10;
  auVar83._8_4_ = auVar24._8_4_ * fVar12;
  auVar83._12_4_ = auVar24._12_4_ * fVar14;
  auVar25 = vfmsub231ps_avx512vl(auVar83,auVar25,auVar23);
  auVar27 = vshufps_avx(auVar25,auVar25,0xc9);
  auVar24 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar25 = vshufps_avx(auVar60,auVar60,0xc9);
  fVar82 = auVar55._0_4_;
  auVar87._0_4_ = auVar25._0_4_ * fVar82;
  fVar11 = auVar55._4_4_;
  auVar87._4_4_ = auVar25._4_4_ * fVar11;
  fVar13 = auVar55._8_4_;
  auVar87._8_4_ = auVar25._8_4_ * fVar13;
  fVar15 = auVar55._12_4_;
  auVar87._12_4_ = auVar25._12_4_ * fVar15;
  auVar25 = vfmsub231ps_fma(auVar87,auVar24,auVar60);
  auVar60 = vshufps_avx(auVar25,auVar25,0xc9);
  auVar51 = vshufps_avx(auVar26,auVar26,0xc9);
  auVar25 = vdpps_avx(auVar28,auVar28,0x7f);
  auVar88._0_4_ = auVar51._0_4_ * fVar82;
  auVar88._4_4_ = auVar51._4_4_ * fVar11;
  auVar88._8_4_ = auVar51._8_4_ * fVar13;
  auVar88._12_4_ = auVar51._12_4_ * fVar15;
  auVar24 = vfmsub231ps_fma(auVar88,auVar24,auVar26);
  auVar51 = vshufps_avx(auVar24,auVar24,0xc9);
  auVar61 = SUB1612(ZEXT816(0),0);
  auVar84._4_12_ = auVar61;
  auVar84._0_4_ = auVar25._0_4_;
  auVar24 = vrsqrt14ss_avx512f(auVar54,auVar84);
  auVar26 = vmulss_avx512f(auVar24,ZEXT416(0x3fc00000));
  auVar22 = vmulss_avx512f(auVar25,SUB6416(ZEXT464(0xbf000000),0));
  auVar22 = vmulss_avx512f(auVar22,auVar24);
  auVar22 = vmulss_avx512f(auVar22,ZEXT416((uint)(auVar24._0_4_ * auVar24._0_4_)));
  auVar24 = vdpps_avx(auVar28,auVar27,0x7f);
  fVar77 = auVar26._0_4_ + auVar22._0_4_;
  fVar103 = auVar28._0_4_ * fVar77;
  fVar106 = auVar28._4_4_ * fVar77;
  fVar107 = auVar28._8_4_ * fVar77;
  fVar108 = auVar28._12_4_ * fVar77;
  auVar26 = vbroadcastss_avx512vl(auVar25);
  auVar27 = vmulps_avx512vl(auVar26,auVar27);
  fVar80 = auVar24._0_4_;
  auVar76._0_4_ = fVar80 * auVar28._0_4_;
  auVar76._4_4_ = fVar80 * auVar28._4_4_;
  auVar76._8_4_ = fVar80 * auVar28._8_4_;
  auVar76._12_4_ = fVar80 * auVar28._12_4_;
  auVar28 = vsubps_avx(auVar27,auVar76);
  auVar24 = vrcp14ss_avx512f(auVar54,auVar84);
  auVar25 = vfnmadd213ss_fma(auVar25,auVar24,SUB6416(ZEXT464(0x40000000),0));
  fVar16 = auVar24._0_4_ * auVar25._0_4_;
  auVar25 = vdpps_avx(auVar60,auVar60,0x7f);
  auVar78._4_12_ = auVar61;
  auVar78._0_4_ = auVar25._0_4_;
  auVar24 = vrsqrt14ss_avx512f(auVar54,auVar78);
  auVar27 = vmulss_avx512f(auVar24,ZEXT416(0x3fc00000));
  fVar80 = auVar24._0_4_;
  fVar80 = auVar27._0_4_ + auVar25._0_4_ * -0.5 * fVar80 * fVar80 * fVar80;
  fVar95 = fVar80 * auVar60._0_4_;
  fVar100 = fVar80 * auVar60._4_4_;
  fVar101 = fVar80 * auVar60._8_4_;
  fVar102 = fVar80 * auVar60._12_4_;
  auVar24 = vdpps_avx(auVar60,auVar51,0x7f);
  auVar27 = vbroadcastss_avx512vl(auVar25);
  auVar27 = vmulps_avx512vl(auVar27,auVar51);
  fVar109 = auVar24._0_4_;
  auVar68._0_4_ = fVar109 * auVar60._0_4_;
  auVar68._4_4_ = fVar109 * auVar60._4_4_;
  auVar68._8_4_ = fVar109 * auVar60._8_4_;
  auVar68._12_4_ = fVar109 * auVar60._12_4_;
  auVar27 = vsubps_avx(auVar27,auVar68);
  auVar24 = vrcp14ss_avx512f(auVar54,auVar78);
  auVar25 = vfnmadd213ss_fma(auVar25,auVar24,SUB6416(ZEXT464(0x40000000),0));
  fVar109 = auVar25._0_4_ * auVar24._0_4_;
  auVar25 = vshufps_avx(auVar50,auVar50,0xff);
  auVar72._0_4_ = fVar103 * auVar25._0_4_;
  auVar72._4_4_ = fVar106 * auVar25._4_4_;
  auVar72._8_4_ = fVar107 * auVar25._8_4_;
  auVar72._12_4_ = fVar108 * auVar25._12_4_;
  auVar60 = vsubps_avx(auVar50,auVar72);
  auVar24 = vshufps_avx(auVar52,auVar52,0xff);
  auVar69._0_4_ = auVar24._0_4_ * fVar103 + fVar77 * fVar16 * auVar28._0_4_ * auVar25._0_4_;
  auVar69._4_4_ = auVar24._4_4_ * fVar106 + fVar77 * fVar16 * auVar28._4_4_ * auVar25._4_4_;
  auVar69._8_4_ = auVar24._8_4_ * fVar107 + fVar77 * fVar16 * auVar28._8_4_ * auVar25._8_4_;
  auVar69._12_4_ = auVar24._12_4_ * fVar108 + fVar77 * fVar16 * auVar28._12_4_ * auVar25._12_4_;
  auVar28 = vsubps_avx(auVar52,auVar69);
  auVar52._0_4_ = auVar50._0_4_ + auVar72._0_4_;
  auVar52._4_4_ = auVar50._4_4_ + auVar72._4_4_;
  auVar52._8_4_ = auVar50._8_4_ + auVar72._8_4_;
  auVar52._12_4_ = auVar50._12_4_ + auVar72._12_4_;
  auVar25 = vshufps_avx(auVar21,auVar21,0xff);
  auVar73._0_4_ = fVar95 * auVar25._0_4_;
  auVar73._4_4_ = fVar100 * auVar25._4_4_;
  auVar73._8_4_ = fVar101 * auVar25._8_4_;
  auVar73._12_4_ = fVar102 * auVar25._12_4_;
  auVar51 = vsubps_avx(auVar21,auVar73);
  auVar24 = vshufps_avx(auVar55,auVar55,0xff);
  auVar58._0_4_ = auVar24._0_4_ * fVar95 + auVar25._0_4_ * fVar80 * auVar27._0_4_ * fVar109;
  auVar58._4_4_ = auVar24._4_4_ * fVar100 + auVar25._4_4_ * fVar80 * auVar27._4_4_ * fVar109;
  auVar58._8_4_ = auVar24._8_4_ * fVar101 + auVar25._8_4_ * fVar80 * auVar27._8_4_ * fVar109;
  auVar58._12_4_ = auVar24._12_4_ * fVar102 + auVar25._12_4_ * fVar80 * auVar27._12_4_ * fVar109;
  auVar25 = vsubps_avx(auVar55,auVar58);
  auVar54._0_4_ = auVar21._0_4_ + auVar73._0_4_;
  auVar54._4_4_ = auVar21._4_4_ + auVar73._4_4_;
  auVar54._8_4_ = auVar21._8_4_ + auVar73._8_4_;
  auVar54._12_4_ = auVar21._12_4_ + auVar73._12_4_;
  auVar92._0_4_ = auVar60._0_4_ + auVar28._0_4_ * 0.33333334;
  auVar92._4_4_ = auVar60._4_4_ + auVar28._4_4_ * 0.33333334;
  auVar92._8_4_ = auVar60._8_4_ + auVar28._8_4_ * 0.33333334;
  auVar92._12_4_ = auVar60._12_4_ + auVar28._12_4_ * 0.33333334;
  auVar66._0_4_ = auVar25._0_4_ * 0.33333334;
  auVar66._4_4_ = auVar25._4_4_ * 0.33333334;
  auVar66._8_4_ = auVar25._8_4_ * 0.33333334;
  auVar66._12_4_ = auVar25._12_4_ * 0.33333334;
  auVar27 = vsubps_avx(auVar51,auVar66);
  auVar105._0_4_ = auVar52._0_4_ + (fVar81 + auVar69._0_4_) * 0.33333334;
  auVar105._4_4_ = auVar52._4_4_ + (fVar10 + auVar69._4_4_) * 0.33333334;
  auVar105._8_4_ = auVar52._8_4_ + (fVar12 + auVar69._8_4_) * 0.33333334;
  auVar105._12_4_ = auVar52._12_4_ + (fVar14 + auVar69._12_4_) * 0.33333334;
  auVar59._0_4_ = (fVar82 + auVar58._0_4_) * 0.33333334;
  auVar59._4_4_ = (fVar11 + auVar58._4_4_) * 0.33333334;
  auVar59._8_4_ = (fVar13 + auVar58._8_4_) * 0.33333334;
  auVar59._12_4_ = (fVar15 + auVar58._12_4_) * 0.33333334;
  auVar55 = vsubps_avx(auVar54,auVar59);
  aVar1 = ofs->field_0;
  auVar25 = vsubps_avx(auVar60,(undefined1  [16])aVar1);
  auVar28._0_4_ = scale * auVar25._0_4_;
  auVar28._4_4_ = scale * auVar25._4_4_;
  auVar28._8_4_ = scale * auVar25._8_4_;
  auVar28._12_4_ = scale * auVar25._12_4_;
  auVar85._4_4_ = auVar28._0_4_;
  auVar85._0_4_ = auVar28._0_4_;
  auVar85._8_4_ = auVar28._0_4_;
  auVar85._12_4_ = auVar28._0_4_;
  auVar24 = vshufps_avx(auVar28,auVar28,0x55);
  aVar2 = (space->vx).field_0;
  auVar28 = vshufps_avx(auVar28,auVar28,0xaa);
  aVar3 = (space->vy).field_0;
  auVar25 = *(undefined1 (*) [16])(space->vz).field_0.m128;
  fVar77 = auVar25._0_4_;
  auVar60._0_4_ = fVar77 * auVar28._0_4_;
  fVar80 = auVar25._4_4_;
  auVar60._4_4_ = fVar80 * auVar28._4_4_;
  fVar81 = auVar25._8_4_;
  auVar60._8_4_ = fVar81 * auVar28._8_4_;
  fVar82 = auVar25._12_4_;
  auVar60._12_4_ = fVar82 * auVar28._12_4_;
  auVar24 = vfmadd231ps_fma(auVar60,(undefined1  [16])aVar3,auVar24);
  auVar60 = vfmadd231ps_fma(auVar24,(undefined1  [16])aVar2,auVar85);
  auVar24 = vsubps_avx(auVar92,(undefined1  [16])aVar1);
  auVar50._0_4_ = scale * auVar24._0_4_;
  auVar50._4_4_ = scale * auVar24._4_4_;
  auVar50._8_4_ = scale * auVar24._8_4_;
  auVar50._12_4_ = scale * auVar24._12_4_;
  auVar93._4_4_ = auVar50._0_4_;
  auVar93._0_4_ = auVar50._0_4_;
  auVar93._8_4_ = auVar50._0_4_;
  auVar93._12_4_ = auVar50._0_4_;
  auVar24 = vshufps_avx(auVar50,auVar50,0x55);
  auVar28 = vshufps_avx(auVar50,auVar50,0xaa);
  auVar86._0_4_ = fVar77 * auVar28._0_4_;
  auVar86._4_4_ = fVar80 * auVar28._4_4_;
  auVar86._8_4_ = fVar81 * auVar28._8_4_;
  auVar86._12_4_ = fVar82 * auVar28._12_4_;
  auVar24 = vfmadd231ps_fma(auVar86,(undefined1  [16])aVar3,auVar24);
  auVar50 = vfmadd231ps_fma(auVar24,(undefined1  [16])aVar2,auVar93);
  auVar24 = vsubps_avx(auVar27,(undefined1  [16])aVar1);
  auVar27._0_4_ = scale * auVar24._0_4_;
  auVar27._4_4_ = scale * auVar24._4_4_;
  auVar27._8_4_ = scale * auVar24._8_4_;
  auVar27._12_4_ = scale * auVar24._12_4_;
  auVar97._4_4_ = auVar27._0_4_;
  auVar97._0_4_ = auVar27._0_4_;
  auVar97._8_4_ = auVar27._0_4_;
  auVar97._12_4_ = auVar27._0_4_;
  auVar24 = vshufps_avx(auVar27,auVar27,0x55);
  auVar28 = vshufps_avx(auVar27,auVar27,0xaa);
  auVar94._0_4_ = fVar77 * auVar28._0_4_;
  auVar94._4_4_ = fVar80 * auVar28._4_4_;
  auVar94._8_4_ = fVar81 * auVar28._8_4_;
  auVar94._12_4_ = fVar82 * auVar28._12_4_;
  auVar24 = vfmadd231ps_fma(auVar94,(undefined1  [16])aVar3,auVar24);
  auVar27 = vfmadd231ps_fma(auVar24,(undefined1  [16])aVar2,auVar97);
  auVar24 = vsubps_avx(auVar51,(undefined1  [16])aVar1);
  auVar51._0_4_ = scale * auVar24._0_4_;
  auVar51._4_4_ = scale * auVar24._4_4_;
  auVar51._8_4_ = scale * auVar24._8_4_;
  auVar51._12_4_ = scale * auVar24._12_4_;
  auVar89._4_4_ = auVar51._0_4_;
  auVar89._0_4_ = auVar51._0_4_;
  auVar89._8_4_ = auVar51._0_4_;
  auVar89._12_4_ = auVar51._0_4_;
  auVar24 = vshufps_avx(auVar51,auVar51,0x55);
  auVar28 = vshufps_avx(auVar51,auVar51,0xaa);
  auVar98._0_4_ = fVar77 * auVar28._0_4_;
  auVar98._4_4_ = fVar80 * auVar28._4_4_;
  auVar98._8_4_ = fVar81 * auVar28._8_4_;
  auVar98._12_4_ = fVar82 * auVar28._12_4_;
  auVar24 = vfmadd231ps_fma(auVar98,(undefined1  [16])aVar3,auVar24);
  auVar51 = vfmadd231ps_fma(auVar24,(undefined1  [16])aVar2,auVar89);
  auVar24 = vsubps_avx(auVar52,(undefined1  [16])aVar1);
  auVar21._0_4_ = scale * auVar24._0_4_;
  auVar21._4_4_ = scale * auVar24._4_4_;
  auVar21._8_4_ = scale * auVar24._8_4_;
  auVar21._12_4_ = scale * auVar24._12_4_;
  auVar22._4_4_ = auVar21._0_4_;
  auVar22._0_4_ = auVar21._0_4_;
  auVar22._8_4_ = auVar21._0_4_;
  auVar22._12_4_ = auVar21._0_4_;
  auVar24 = vshufps_avx(auVar21,auVar21,0x55);
  auVar28 = vshufps_avx(auVar21,auVar21,0xaa);
  auVar28 = vmulps_avx512vl(auVar25,auVar28);
  auVar24 = vfmadd231ps_avx512vl(auVar28,(undefined1  [16])aVar3,auVar24);
  auVar21 = vfmadd231ps_avx512vl(auVar24,(undefined1  [16])aVar2,auVar22);
  auVar24 = vsubps_avx(auVar105,(undefined1  [16])aVar1);
  auVar23._0_4_ = scale * auVar24._0_4_;
  auVar23._4_4_ = scale * auVar24._4_4_;
  auVar23._8_4_ = scale * auVar24._8_4_;
  auVar23._12_4_ = scale * auVar24._12_4_;
  auVar90._4_4_ = auVar23._0_4_;
  auVar90._0_4_ = auVar23._0_4_;
  auVar90._8_4_ = auVar23._0_4_;
  auVar90._12_4_ = auVar23._0_4_;
  auVar24 = vshufps_avx(auVar23,auVar23,0x55);
  auVar28 = vshufps_avx(auVar23,auVar23,0xaa);
  auVar28 = vmulps_avx512vl(auVar25,auVar28);
  auVar24 = vfmadd231ps_avx512vl(auVar28,(undefined1  [16])aVar3,auVar24);
  auVar26 = vfmadd231ps_avx512vl(auVar24,(undefined1  [16])aVar2,auVar90);
  auVar24 = vsubps_avx(auVar55,(undefined1  [16])aVar1);
  auVar64._0_4_ = scale * auVar24._0_4_;
  auVar64._4_4_ = scale * auVar24._4_4_;
  auVar64._8_4_ = scale * auVar24._8_4_;
  auVar64._12_4_ = scale * auVar24._12_4_;
  auVar91._4_4_ = auVar64._0_4_;
  auVar91._0_4_ = auVar64._0_4_;
  auVar91._8_4_ = auVar64._0_4_;
  auVar91._12_4_ = auVar64._0_4_;
  auVar24 = vshufps_avx(auVar64,auVar64,0x55);
  auVar28 = vshufps_avx(auVar64,auVar64,0xaa);
  auVar25 = vmulps_avx512vl(auVar25,auVar28);
  auVar25 = vfmadd231ps_avx512vl(auVar25,(undefined1  [16])aVar3,auVar24);
  auVar28 = vfmadd231ps_avx512vl(auVar25,(undefined1  [16])aVar2,auVar91);
  auVar25 = vsubps_avx(auVar54,(undefined1  [16])aVar1);
  auVar55._0_4_ = scale * auVar25._0_4_;
  auVar55._4_4_ = scale * auVar25._4_4_;
  auVar55._8_4_ = scale * auVar25._8_4_;
  auVar55._12_4_ = scale * auVar25._12_4_;
  auVar74._4_4_ = auVar55._0_4_;
  auVar74._0_4_ = auVar55._0_4_;
  auVar74._8_4_ = auVar55._0_4_;
  auVar74._12_4_ = auVar55._0_4_;
  auVar25 = vshufps_avx(auVar55,auVar55,0x55);
  auVar24 = vshufps_avx(auVar55,auVar55,0xaa);
  auVar70._0_4_ = fVar77 * auVar24._0_4_;
  auVar70._4_4_ = fVar80 * auVar24._4_4_;
  auVar70._8_4_ = fVar81 * auVar24._8_4_;
  auVar70._12_4_ = fVar82 * auVar24._12_4_;
  auVar25 = vfmadd231ps_fma(auVar70,(undefined1  [16])aVar3,auVar25);
  auVar25 = vfmadd231ps_fma(auVar25,(undefined1  [16])aVar2,auVar74);
  auVar29 = vbroadcastss_avx512vl(ZEXT416(1));
  uVar57 = auVar60._0_4_;
  auVar45._4_4_ = uVar57;
  auVar45._0_4_ = uVar57;
  auVar45._8_4_ = uVar57;
  auVar45._12_4_ = uVar57;
  auVar45._16_4_ = uVar57;
  auVar45._20_4_ = uVar57;
  auVar45._24_4_ = uVar57;
  auVar45._28_4_ = uVar57;
  auVar30 = vpermps_avx512vl(auVar29,ZEXT1632(auVar60));
  auVar31 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar32 = vpermps_avx512vl(auVar31,ZEXT1632(auVar60));
  auVar33 = vbroadcastss_avx512vl(auVar50);
  auVar34 = vpermps_avx512vl(auVar29,ZEXT1632(auVar50));
  auVar35 = vpermps_avx512vl(auVar31,ZEXT1632(auVar50));
  auVar36 = vbroadcastss_avx512vl(auVar27);
  auVar37 = vpermps_avx512vl(auVar29,ZEXT1632(auVar27));
  auVar38 = vpermps_avx512vl(auVar31,ZEXT1632(auVar27));
  auVar39 = vbroadcastss_avx512vl(auVar51);
  auVar40 = vpermps_avx512vl(auVar29,ZEXT1632(auVar51));
  auVar41 = vpermps_avx512vl(auVar31,ZEXT1632(auVar51));
  auVar42 = vmulps_avx512vl(auVar39,bezier_basis0._3944_32_);
  auVar43 = vmulps_avx512vl(auVar40,bezier_basis0._3944_32_);
  auVar44 = vmulps_avx512vl(auVar41,bezier_basis0._3944_32_);
  auVar42 = vfmadd231ps_avx512vl(auVar42,bezier_basis0._2788_32_,auVar36);
  auVar43 = vfmadd231ps_avx512vl(auVar43,bezier_basis0._2788_32_,auVar37);
  auVar44 = vfmadd231ps_avx512vl(auVar44,bezier_basis0._2788_32_,auVar38);
  auVar42 = vfmadd231ps_avx512vl(auVar42,bezier_basis0._1632_32_,auVar33);
  auVar43 = vfmadd231ps_avx512vl(auVar43,bezier_basis0._1632_32_,auVar34);
  auVar44 = vfmadd231ps_avx512vl(auVar44,bezier_basis0._1632_32_,auVar35);
  auVar24 = vfmadd231ps_fma(auVar42,bezier_basis0._476_32_,auVar45);
  auVar42 = vfmadd231ps_avx512vl(auVar43,bezier_basis0._476_32_,auVar30);
  auVar43 = vfmadd231ps_avx512vl(auVar44,bezier_basis0._476_32_,auVar32);
  auVar39 = vmulps_avx512vl(auVar39,bezier_basis0._8568_32_);
  auVar40 = vmulps_avx512vl(auVar40,bezier_basis0._8568_32_);
  auVar41 = vmulps_avx512vl(auVar41,bezier_basis0._8568_32_);
  auVar36 = vfmadd231ps_avx512vl(auVar39,bezier_basis0._7412_32_,auVar36);
  auVar37 = vfmadd231ps_avx512vl(auVar40,bezier_basis0._7412_32_,auVar37);
  auVar38 = vfmadd231ps_avx512vl(auVar41,bezier_basis0._7412_32_,auVar38);
  auVar33 = vfmadd231ps_avx512vl(auVar36,bezier_basis0._6256_32_,auVar33);
  auVar34 = vfmadd231ps_avx512vl(auVar37,bezier_basis0._6256_32_,auVar34);
  auVar35 = vfmadd231ps_avx512vl(auVar38,bezier_basis0._6256_32_,auVar35);
  auVar33 = vfmadd231ps_avx512vl(auVar33,bezier_basis0._5100_32_,auVar45);
  auVar30 = vfmadd231ps_avx512vl(auVar34,bezier_basis0._5100_32_,auVar30);
  auVar32 = vfmadd231ps_avx512vl(auVar35,bezier_basis0._5100_32_,auVar32);
  auVar37._8_4_ = 0x3d638e39;
  auVar37._0_8_ = 0x3d638e393d638e39;
  auVar37._12_4_ = 0x3d638e39;
  auVar37._16_4_ = 0x3d638e39;
  auVar37._20_4_ = 0x3d638e39;
  auVar37._24_4_ = 0x3d638e39;
  auVar37._28_4_ = 0x3d638e39;
  auVar35 = vmulps_avx512vl(auVar33,auVar37);
  auVar36 = vmulps_avx512vl(auVar30,auVar37);
  auVar37 = vmulps_avx512vl(auVar32,auVar37);
  auVar30 = vblendps_avx(auVar35,ZEXT832(0) << 0x20,1);
  auVar32 = vblendps_avx(auVar36,ZEXT832(0) << 0x20,1);
  auVar40 = ZEXT832(0) << 0x20;
  auVar33 = vblendps_avx(auVar37,auVar40,1);
  auVar34 = vsubps_avx(ZEXT1632(auVar24),auVar30);
  auVar38 = vsubps_avx512vl(auVar42,auVar32);
  auVar39 = vsubps_avx512vl(auVar43,auVar33);
  auVar30 = vblendps_avx(auVar35,auVar40,0x80);
  auVar32 = vblendps_avx(auVar36,auVar40,0x80);
  auVar33 = vblendps_avx(auVar37,auVar40,0x80);
  auVar36 = vaddps_avx512vl(ZEXT1632(auVar24),auVar30);
  auVar32 = vaddps_avx512vl(auVar42,auVar32);
  auVar33 = vaddps_avx512vl(auVar43,auVar33);
  auVar79._8_4_ = 0x7f800000;
  auVar79._0_8_ = 0x7f8000007f800000;
  auVar79._12_4_ = 0x7f800000;
  auVar79._16_4_ = 0x7f800000;
  auVar79._20_4_ = 0x7f800000;
  auVar79._24_4_ = 0x7f800000;
  auVar79._28_4_ = 0x7f800000;
  auVar30 = vminps_avx(auVar79,ZEXT1632(auVar24));
  auVar37 = vminps_avx512vl(auVar79,auVar42);
  auVar40 = vminps_avx512vl(auVar79,auVar43);
  auVar35 = vminps_avx512vl(auVar34,auVar36);
  auVar35 = vminps_avx(auVar30,auVar35);
  auVar30 = vminps_avx512vl(auVar38,auVar32);
  auVar41 = vminps_avx512vl(auVar37,auVar30);
  auVar30 = vminps_avx512vl(auVar39,auVar33);
  auVar40 = vminps_avx512vl(auVar40,auVar30);
  auVar44 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  auVar30 = vmaxps_avx512vl(auVar44,ZEXT1632(auVar24));
  auVar37 = vmaxps_avx512vl(auVar44,auVar42);
  auVar42 = vmaxps_avx512vl(auVar44,auVar43);
  auVar34 = vmaxps_avx512vl(auVar34,auVar36);
  auVar43 = vmaxps_avx512vl(auVar30,auVar34);
  auVar30 = vmaxps_avx512vl(auVar38,auVar32);
  auVar45 = vmaxps_avx512vl(auVar37,auVar30);
  auVar30 = vmaxps_avx512vl(auVar39,auVar33);
  auVar42 = vmaxps_avx512vl(auVar42,auVar30);
  auVar30 = vbroadcastss_avx512vl(auVar21);
  auVar32 = vpermps_avx512vl(auVar29,ZEXT1632(auVar21));
  auVar33 = vpermps_avx512vl(auVar31,ZEXT1632(auVar21));
  auVar34 = vbroadcastss_avx512vl(auVar26);
  auVar36 = vpermps_avx512vl(auVar29,ZEXT1632(auVar26));
  auVar37 = vpermps_avx512vl(auVar31,ZEXT1632(auVar26));
  auVar38 = vbroadcastss_avx512vl(auVar28);
  auVar39 = vpermps_avx512vl(auVar29,ZEXT1632(auVar28));
  auVar46 = vpermps_avx512vl(auVar31,ZEXT1632(auVar28));
  uVar57 = auVar25._0_4_;
  auVar56._4_4_ = uVar57;
  auVar56._0_4_ = uVar57;
  auVar56._8_4_ = uVar57;
  auVar56._12_4_ = uVar57;
  auVar56._16_4_ = uVar57;
  auVar56._20_4_ = uVar57;
  auVar56._24_4_ = uVar57;
  auVar56._28_4_ = uVar57;
  auVar29 = vpermps_avx512vl(auVar29,ZEXT1632(auVar25));
  auVar31 = vpermps_avx512vl(auVar31,ZEXT1632(auVar25));
  auVar47 = vmulps_avx512vl(auVar56,bezier_basis0._3944_32_);
  auVar48 = vmulps_avx512vl(auVar29,bezier_basis0._3944_32_);
  auVar49 = vmulps_avx512vl(auVar31,bezier_basis0._3944_32_);
  auVar47 = vfmadd231ps_avx512vl(auVar47,bezier_basis0._2788_32_,auVar38);
  auVar48 = vfmadd231ps_avx512vl(auVar48,bezier_basis0._2788_32_,auVar39);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar46,bezier_basis0._2788_32_);
  auVar47 = vfmadd231ps_avx512vl(auVar47,bezier_basis0._1632_32_,auVar34);
  auVar48 = vfmadd231ps_avx512vl(auVar48,bezier_basis0._1632_32_,auVar36);
  auVar49 = vfmadd231ps_avx512vl(auVar49,auVar37,bezier_basis0._1632_32_);
  auVar25 = vfmadd231ps_fma(auVar47,bezier_basis0._476_32_,auVar30);
  auVar47 = vfmadd231ps_avx512vl(auVar48,bezier_basis0._476_32_,auVar32);
  auVar48 = vfmadd231ps_avx512vl(auVar49,auVar33,bezier_basis0._476_32_);
  auVar49 = vmulps_avx512vl(auVar56,bezier_basis0._8568_32_);
  auVar29 = vmulps_avx512vl(auVar29,bezier_basis0._8568_32_);
  auVar31 = vmulps_avx512vl(auVar31,bezier_basis0._8568_32_);
  auVar38 = vfmadd231ps_avx512vl(auVar49,bezier_basis0._7412_32_,auVar38);
  auVar29 = vfmadd231ps_avx512vl(auVar29,bezier_basis0._7412_32_,auVar39);
  auVar31 = vfmadd231ps_avx512vl(auVar31,bezier_basis0._7412_32_,auVar46);
  auVar34 = vfmadd231ps_avx512vl(auVar38,bezier_basis0._6256_32_,auVar34);
  auVar29 = vfmadd231ps_avx512vl(auVar29,bezier_basis0._6256_32_,auVar36);
  auVar31 = vfmadd231ps_avx512vl(auVar31,bezier_basis0._6256_32_,auVar37);
  auVar24 = vfmadd231ps_fma(auVar34,bezier_basis0._5100_32_,auVar30);
  auVar30 = vfmadd231ps_avx512vl(auVar29,bezier_basis0._5100_32_,auVar32);
  auVar32 = vfmadd231ps_avx512vl(auVar31,bezier_basis0._5100_32_,auVar33);
  auVar31 = ZEXT1632(CONCAT412(auVar24._12_4_ * 0.055555556,
                               CONCAT48(auVar24._8_4_ * 0.055555556,
                                        CONCAT44(auVar24._4_4_ * 0.055555556,
                                                 auVar24._0_4_ * 0.055555556))));
  auVar34._4_4_ = auVar30._4_4_ * 0.055555556;
  auVar34._0_4_ = auVar30._0_4_ * 0.055555556;
  auVar34._8_4_ = auVar30._8_4_ * 0.055555556;
  auVar34._12_4_ = auVar30._12_4_ * 0.055555556;
  auVar34._16_4_ = auVar30._16_4_ * 0.055555556;
  auVar34._20_4_ = auVar30._20_4_ * 0.055555556;
  auVar34._24_4_ = auVar30._24_4_ * 0.055555556;
  auVar34._28_4_ = auVar30._28_4_;
  auVar29._4_4_ = auVar32._4_4_ * 0.055555556;
  auVar29._0_4_ = auVar32._0_4_ * 0.055555556;
  auVar29._8_4_ = auVar32._8_4_ * 0.055555556;
  auVar29._12_4_ = auVar32._12_4_ * 0.055555556;
  auVar29._16_4_ = auVar32._16_4_ * 0.055555556;
  auVar29._20_4_ = auVar32._20_4_ * 0.055555556;
  auVar29._24_4_ = auVar32._24_4_ * 0.055555556;
  auVar29._28_4_ = 0x3d638e39;
  auVar36 = ZEXT832(0) << 0x20;
  auVar30 = vblendps_avx(auVar31,auVar36,1);
  auVar32 = vblendps_avx(auVar34,auVar36,1);
  auVar33 = vblendps_avx(auVar29,auVar36,1);
  auVar37 = vsubps_avx(ZEXT1632(auVar25),auVar30);
  auVar38 = vsubps_avx(auVar47,auVar32);
  auVar39 = vsubps_avx(auVar48,auVar33);
  auVar30 = vblendps_avx(auVar31,auVar36,0x80);
  auVar32 = vblendps_avx(auVar34,auVar36,0x80);
  auVar33 = vblendps_avx(auVar29,auVar36,0x80);
  auVar46._0_4_ = auVar25._0_4_ + auVar30._0_4_;
  auVar46._4_4_ = auVar25._4_4_ + auVar30._4_4_;
  auVar46._8_4_ = auVar25._8_4_ + auVar30._8_4_;
  auVar46._12_4_ = auVar25._12_4_ + auVar30._12_4_;
  auVar46._16_4_ = auVar30._16_4_ + 0.0;
  auVar46._20_4_ = auVar30._20_4_ + 0.0;
  auVar46._24_4_ = auVar30._24_4_ + 0.0;
  auVar46._28_4_ = auVar30._28_4_ + 0.0;
  auVar49._0_4_ = auVar47._0_4_ + auVar32._0_4_;
  auVar49._4_4_ = auVar47._4_4_ + auVar32._4_4_;
  auVar49._8_4_ = auVar47._8_4_ + auVar32._8_4_;
  auVar49._12_4_ = auVar47._12_4_ + auVar32._12_4_;
  auVar49._16_4_ = auVar47._16_4_ + auVar32._16_4_;
  auVar49._20_4_ = auVar47._20_4_ + auVar32._20_4_;
  auVar49._24_4_ = auVar47._24_4_ + auVar32._24_4_;
  auVar49._28_4_ = auVar47._28_4_ + auVar32._28_4_;
  auVar99._0_4_ = auVar48._0_4_ + auVar33._0_4_;
  auVar99._4_4_ = auVar48._4_4_ + auVar33._4_4_;
  auVar99._8_4_ = auVar48._8_4_ + auVar33._8_4_;
  auVar99._12_4_ = auVar48._12_4_ + auVar33._12_4_;
  auVar99._16_4_ = auVar48._16_4_ + auVar33._16_4_;
  auVar99._20_4_ = auVar48._20_4_ + auVar33._20_4_;
  auVar99._24_4_ = auVar48._24_4_ + auVar33._24_4_;
  auVar99._28_4_ = auVar48._28_4_ + auVar33._28_4_;
  auVar30 = vminps_avx(auVar79,ZEXT1632(auVar25));
  auVar32 = vminps_avx(auVar79,auVar47);
  auVar33 = vminps_avx(auVar79,auVar48);
  auVar34 = vminps_avx(auVar37,auVar46);
  auVar29 = vminps_avx(auVar30,auVar34);
  auVar30 = vminps_avx(auVar38,auVar49);
  auVar31 = vminps_avx(auVar32,auVar30);
  auVar30 = vminps_avx(auVar39,auVar99);
  auVar36 = vminps_avx(auVar33,auVar30);
  auVar32 = vmaxps_avx512vl(auVar44,ZEXT1632(auVar25));
  auVar33 = vmaxps_avx512vl(auVar44,auVar47);
  auVar34 = vmaxps_avx512vl(auVar44,auVar48);
  auVar30 = vmaxps_avx(auVar37,auVar46);
  auVar30 = vmaxps_avx(auVar32,auVar30);
  auVar32 = vmaxps_avx(auVar38,auVar49);
  auVar32 = vmaxps_avx(auVar33,auVar32);
  auVar33 = vmaxps_avx(auVar39,auVar99);
  auVar33 = vmaxps_avx(auVar34,auVar33);
  auVar34 = vshufps_avx512vl(auVar43,auVar43,0xb1);
  auVar37 = vmaxps_avx512vl(auVar43,auVar34);
  auVar34 = vshufpd_avx(auVar37,auVar37,5);
  auVar34 = vmaxps_avx(auVar37,auVar34);
  auVar25 = vmaxps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar34 = vshufps_avx512vl(auVar45,auVar45,0xb1);
  auVar37 = vmaxps_avx512vl(auVar45,auVar34);
  auVar34 = vshufpd_avx(auVar37,auVar37,5);
  auVar34 = vmaxps_avx(auVar37,auVar34);
  auVar24 = vmaxps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar24 = vunpcklps_avx(auVar25,auVar24);
  auVar34 = vshufps_avx(auVar42,auVar42,0xb1);
  auVar34 = vmaxps_avx(auVar42,auVar34);
  auVar37 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vmaxps_avx(auVar34,auVar37);
  auVar25 = vmaxps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar25 = vinsertps_avx(auVar24,auVar25,0x28);
  auVar34 = vshufps_avx(auVar35,auVar35,0xb1);
  auVar34 = vminps_avx(auVar35,auVar34);
  auVar35 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vminps_avx(auVar34,auVar35);
  auVar24 = vminps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar34 = vshufps_avx(auVar41,auVar41,0xb1);
  auVar34 = vminps_avx(auVar41,auVar34);
  auVar35 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vminps_avx(auVar34,auVar35);
  auVar28 = vminps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar28 = vunpcklps_avx(auVar24,auVar28);
  auVar34 = vshufps_avx512vl(auVar40,auVar40,0xb1);
  auVar35 = vminps_avx512vl(auVar40,auVar34);
  auVar34 = vshufpd_avx(auVar35,auVar35,5);
  auVar34 = vminps_avx(auVar35,auVar34);
  auVar24 = vminps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar24 = vinsertps_avx(auVar28,auVar24,0x28);
  auVar34 = vshufps_avx(auVar29,auVar29,0xb1);
  auVar34 = vminps_avx(auVar29,auVar34);
  auVar35 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vminps_avx(auVar34,auVar35);
  auVar28 = vminps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar34 = vshufps_avx(auVar31,auVar31,0xb1);
  auVar34 = vminps_avx(auVar31,auVar34);
  auVar35 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vminps_avx(auVar34,auVar35);
  auVar27 = vminps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar27 = vunpcklps_avx(auVar28,auVar27);
  auVar34 = vshufps_avx(auVar36,auVar36,0xb1);
  auVar34 = vminps_avx(auVar36,auVar34);
  auVar35 = vshufpd_avx(auVar34,auVar34,5);
  auVar34 = vminps_avx(auVar34,auVar35);
  auVar28 = vminps_avx(auVar34._0_16_,auVar34._16_16_);
  auVar28 = vinsertps_avx(auVar27,auVar28,0x28);
  auVar27 = vminps_avx(auVar24,auVar28);
  auVar34 = vshufps_avx(auVar30,auVar30,0xb1);
  auVar30 = vmaxps_avx(auVar30,auVar34);
  auVar34 = vshufpd_avx(auVar30,auVar30,5);
  auVar30 = vmaxps_avx(auVar30,auVar34);
  auVar24 = vmaxps_avx(auVar30._0_16_,auVar30._16_16_);
  auVar30 = vshufps_avx(auVar32,auVar32,0xb1);
  auVar30 = vmaxps_avx(auVar32,auVar30);
  auVar32 = vshufpd_avx(auVar30,auVar30,5);
  auVar30 = vmaxps_avx(auVar30,auVar32);
  auVar28 = vmaxps_avx(auVar30._0_16_,auVar30._16_16_);
  auVar28 = vunpcklps_avx(auVar24,auVar28);
  auVar30 = vshufps_avx(auVar33,auVar33,0xb1);
  auVar30 = vmaxps_avx(auVar33,auVar30);
  auVar32 = vshufpd_avx(auVar30,auVar30,5);
  auVar30 = vmaxps_avx(auVar30,auVar32);
  auVar24 = vmaxps_avx(auVar30._0_16_,auVar30._16_16_);
  auVar24 = vinsertps_avx(auVar28,auVar24,0x28);
  auVar28 = vmaxps_avx(auVar25,auVar24);
  auVar24._8_4_ = 0x7fffffff;
  auVar24._0_8_ = 0x7fffffff7fffffff;
  auVar24._12_4_ = 0x7fffffff;
  auVar25 = vandps_avx(auVar27,auVar24);
  auVar24 = vandps_avx(auVar28,auVar24);
  auVar25 = vmaxps_avx(auVar25,auVar24);
  auVar24 = vmovshdup_avx(auVar25);
  auVar24 = vmaxss_avx(auVar24,auVar25);
  auVar25 = vshufpd_avx(auVar25,auVar25,1);
  auVar25 = vmaxss_avx(auVar25,auVar24);
  fVar77 = auVar25._0_4_ * 4.7683716e-07;
  auVar25._4_4_ = fVar77;
  auVar25._0_4_ = fVar77;
  auVar25._8_4_ = fVar77;
  auVar25._12_4_ = fVar77;
  aVar1 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar27,auVar25);
  (__return_storage_ptr__->lower).field_0 = aVar1;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar28._0_4_ + fVar77;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar28._4_4_ + fVar77;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar28._8_4_ + fVar77;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar28._12_4_ + fVar77;
  return __return_storage_ptr__;
}

Assistant:

size_t CurveGeometry::getGeometryDataDeviceByteSize() const {
    size_t byte_size = sizeof(CurveGeometry);
    if (vertices.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (normals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    if (tangents.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (dnormals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    return 16 * ((byte_size + 15) / 16);
  }